

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O3

Slice leveldb::test::RandomString(Random *rnd,int len,string *dst)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  Slice SVar5;
  
  std::__cxx11::string::resize((ulong)dst,(char)len);
  if (0 < len) {
    uVar2 = 0;
    do {
      uVar3 = (uint)((ulong)*(uint *)rnd * 0x41a7) & 0x7fffffff;
      iVar1 = (int)((ulong)*(uint *)rnd * 0x41a7 >> 0x1f);
      uVar4 = iVar1 + uVar3;
      uVar3 = iVar1 + uVar3 + 0x80000001;
      if (-1 < (int)uVar4) {
        uVar3 = uVar4;
      }
      *(uint *)rnd = uVar3;
      (dst->_M_dataplus)._M_p[uVar2] = (char)uVar3 + (char)(uVar3 / 0x5f) * -0x5f + ' ';
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  SVar5.data_ = (dst->_M_dataplus)._M_p;
  SVar5.size_ = dst->_M_string_length;
  return SVar5;
}

Assistant:

Slice RandomString(Random* rnd, int len, std::string* dst) {
  dst->resize(len);
  for (int i = 0; i < len; i++) {
    (*dst)[i] = static_cast<char>(' ' + rnd->Uniform(95));  // ' ' .. '~'
  }
  return Slice(*dst);
}